

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void getWTREECoeffs(wtree_object wt,int X,int Y,double *coeffs,int N)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  char *__format;
  ulong uVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = wt->J;
  if ((X < 1) || ((int)uVar1 < X)) {
    __format = "X co-ordinate must be >= 1 and <= %d";
  }
  else {
    iVar6 = 1;
    iVar5 = X;
    while (bVar7 = iVar5 != 0, iVar5 = iVar5 + -1, bVar7) {
      iVar6 = iVar6 * 2;
    }
    if ((-1 < Y) && (Y < iVar6)) {
      uVar2 = 0;
      iVar6 = 0;
      if (X != 1) {
        iVar3 = X + -1;
        iVar5 = 1;
        iVar6 = 0;
        while (bVar7 = iVar3 != 0, iVar3 = iVar3 + -1, bVar7) {
          iVar6 = iVar6 + iVar5 * 2;
          iVar5 = iVar5 * 2;
        }
      }
      iVar6 = wt->nodelength[iVar6 + Y];
      uVar4 = (ulong)(uint)N;
      if (N < 1) {
        uVar4 = uVar2;
      }
      for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
        coeffs[uVar2] = wt->output[(long)iVar6 + uVar2];
      }
      return;
    }
    uVar1 = iVar6 - 1;
    __format = "Y co-ordinate must be >= 0 and <= %d";
  }
  printf(__format,(ulong)uVar1);
  exit(-1);
}

Assistant:

void getWTREECoeffs(wtree_object wt, int X,int Y,double *coeffs,int N) {
	int ymax,i,t,t2;

	if (X <= 0 || X > wt->J) {
		printf("X co-ordinate must be >= 1 and <= %d", wt->J);
		exit(-1);
	}
	ymax = 1;
	for (i = 0; i < X; ++i) {
		ymax *= 2;
	}

	ymax -= 1;

	if (Y < 0 ||Y > ymax) {
		printf("Y co-ordinate must be >= 0 and <= %d", ymax);
		exit(-1);
	}

	if (X == 1) {
		t = 0;
	}
	else {
		t = 0;
		t2 = 1;
		for (i = 0; i < X - 1; ++i) {
			t2 *= 2;
			t += t2;
		}
	}

	t += Y;
	t2 = wt->nodelength[t];
	for (i = 0; i < N; ++i) {
		coeffs[i] = wt->output[t2+i];
	}

}